

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaAnnotPtr xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int needed)

{
  _xmlAttr *p_Var1;
  xmlSchemaTypePtr ownerElem;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  xmlNs *pxVar7;
  xmlSchemaTypePtr attr;
  xmlSchemaTypePtr in_RCX;
  undefined4 in_register_00000014;
  ulong uVar8;
  ulong extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr pxVar9;
  _xmlAttr **pp_Var10;
  _xmlAttr **pp_Var11;
  char *str2;
  xmlChar *str1;
  xmlChar **in_R8;
  char *in_R9;
  _xmlNode **pp_Var12;
  undefined1 auVar13 [16];
  xmlSchemaAnnotPtr content;
  undefined8 *puVar6;
  
  uVar8 = CONCAT44(in_register_00000014,needed);
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaAnnotPtr)0x0;
  }
  if (needed != 0) {
    auVar13 = (undefined1  [16])(*xmlMalloc)(0x10);
    puVar6 = auVar13._0_8_;
    if (puVar6 != (undefined8 *)0x0) {
      *puVar6 = 0;
      puVar6[1] = node;
      goto LAB_001b1fb1;
    }
    xmlSchemaPErrMemory(ctxt,"allocating annotation",node);
    uVar8 = extraout_RDX;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  auVar13 = auVar4 << 0x40;
LAB_001b1fb1:
  pp_Var10 = &node->properties;
  while( true ) {
    content = auVar13._0_8_;
    p_Var1 = *pp_Var10;
    if (p_Var1 == (_xmlAttr *)0x0) break;
    pxVar7 = p_Var1->ns;
    if (pxVar7 == (xmlNs *)0x0) {
      iVar5 = xmlStrEqual(p_Var1->name,"id");
      pxVar9 = extraout_RDX_01;
      if (iVar5 == 0) goto LAB_001b2001;
      pxVar7 = p_Var1->ns;
      if (pxVar7 != (xmlNs *)0x0) goto LAB_001b1fd4;
    }
    else {
LAB_001b1fd4:
      iVar5 = xmlStrEqual(pxVar7->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar9 = extraout_RDX_00;
      if (iVar5 != 0) {
LAB_001b2001:
        xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar9,(xmlAttrPtr)in_RCX);
        pxVar9 = extraout_RDX_02;
      }
    }
    auVar13._8_8_ = pxVar9;
    auVar13._0_8_ = content;
    pp_Var10 = &p_Var1->next;
  }
  xmlSchemaPValAttrID(ctxt,node,auVar13._8_8_);
  pp_Var12 = &node->children;
  bVar3 = false;
  do {
    ownerElem = (xmlSchemaTypePtr)*pp_Var12;
    if (ownerElem == (xmlSchemaTypePtr)0x0) {
      return content;
    }
    if (ownerElem->node == (xmlNodePtr)0x0) {
LAB_001b218a:
      bVar2 = !bVar3;
      bVar3 = true;
      if (bVar2) {
        in_R8 = (xmlChar **)0x0;
        in_R9 = "(appinfo | documentation)*";
        in_RCX = ownerElem;
        xmlSchemaPContentErr
                  (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                   (xmlNodePtr)ownerElem,(xmlNodePtr)0x0,"(appinfo | documentation)*",
                   (char *)content);
        bVar3 = true;
      }
    }
    else {
      iVar5 = xmlStrEqual(ownerElem->name,(xmlChar *)"appinfo");
      if ((iVar5 == 0) ||
         (iVar5 = xmlStrEqual(ownerElem->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar5 == 0)) {
        if ((ownerElem->node == (xmlNodePtr)0x0) ||
           ((iVar5 = xmlStrEqual(ownerElem->name,(xmlChar *)"documentation"), iVar5 == 0 ||
            (iVar5 = xmlStrEqual(ownerElem->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                                ), iVar5 == 0)))) goto LAB_001b218a;
        pp_Var10 = (_xmlAttr **)&ownerElem->flags;
        pp_Var11 = pp_Var10;
        while (p_Var1 = *pp_Var11, p_Var1 != (_xmlAttr *)0x0) {
          if (p_Var1->ns == (xmlNs *)0x0) {
            str1 = p_Var1->name;
            str2 = "source";
LAB_001b2170:
            iVar5 = xmlStrEqual(str1,(xmlChar *)str2);
            pxVar9 = extraout_RDX_06;
            if (iVar5 == 0) {
LAB_001b2179:
              xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar9,(xmlAttrPtr)in_RCX);
            }
          }
          else {
            iVar5 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            pxVar9 = extraout_RDX_05;
            if (iVar5 != 0) goto LAB_001b2179;
            iVar5 = xmlStrEqual(p_Var1->name,"lang");
            if (iVar5 != 0) {
              str1 = p_Var1->ns->href;
              str2 = "http://www.w3.org/XML/1998/namespace";
              goto LAB_001b2170;
            }
          }
          pp_Var11 = &p_Var1->next;
        }
        while (p_Var1 = *pp_Var10, p_Var1 != (_xmlAttr *)0x0) {
          if (((p_Var1->ns != (xmlNs *)0x0) &&
              (iVar5 = xmlStrEqual(p_Var1->name,"lang"), iVar5 != 0)) &&
             (iVar5 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/XML/1998/namespace"
                                 ), iVar5 != 0)) {
            attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE);
            in_RCX = (xmlSchemaTypePtr)0x0;
            xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)p_Var1,(xmlAttrPtr)attr,(xmlSchemaTypePtr)0x0,
                       in_R8);
            break;
          }
          pp_Var10 = &p_Var1->next;
        }
      }
      else {
        pp_Var10 = (_xmlAttr **)&ownerElem->flags;
        while (p_Var1 = *pp_Var10, p_Var1 != (_xmlAttr *)0x0) {
          pxVar7 = p_Var1->ns;
          if (pxVar7 == (xmlNs *)0x0) {
            iVar5 = xmlStrEqual(p_Var1->name,"source");
            pxVar9 = extraout_RDX_04;
            if (iVar5 == 0) goto LAB_001b20cb;
            pxVar7 = p_Var1->ns;
            if (pxVar7 != (xmlNs *)0x0) goto LAB_001b209e;
          }
          else {
LAB_001b209e:
            iVar5 = xmlStrEqual(pxVar7->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            pxVar9 = extraout_RDX_03;
            if (iVar5 != 0) {
LAB_001b20cb:
              xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar9,(xmlAttrPtr)in_RCX);
            }
          }
          pp_Var10 = &p_Var1->next;
        }
        in_RCX = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
        in_R8 = (xmlChar **)0x0;
        xmlSchemaPValAttr(ctxt,(xmlSchemaBasicItemPtr)ownerElem,(xmlNodePtr)0x1f6df5,(char *)in_RCX,
                          (xmlSchemaTypePtr)0x0,(xmlChar **)in_R9);
      }
    }
    pp_Var12 = (_xmlNode **)&ownerElem->annot;
  } while( true );
}

Assistant:

static xmlSchemaAnnotPtr
xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node, int needed)
{
    xmlSchemaAnnotPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int barked = 0;

    /*
    * INFO: S4S completed.
    */
    /*
    * id = ID
    * {any attributes with non-schema namespace . . .}>
    * Content: (appinfo | documentation)*
    */
    if ((ctxt == NULL) || (node == NULL))
        return (NULL);
    if (needed)
	ret = xmlSchemaNewAnnot(ctxt, node);
    else
	ret = NULL;
    attr = node->properties;
    while (attr != NULL) {
	if (((attr->ns == NULL) &&
	    (!xmlStrEqual(attr->name, BAD_CAST "id"))) ||
	    ((attr->ns != NULL) &&
	    xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    while (child != NULL) {
	if (IS_SCHEMA(child, "appinfo")) {
	    /* TODO: make available the content of "appinfo". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (((attr->ns == NULL) &&
		     (!xmlStrEqual(attr->name, BAD_CAST "source"))) ||
		     ((attr->ns != NULL) &&
		      xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
		attr = attr->next;
	    }
	    xmlSchemaPValAttr(ctxt, NULL, child, "source",
		xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI), NULL);
	    child = child->next;
	} else if (IS_SCHEMA(child, "documentation")) {
	    /* TODO: make available the content of "documentation". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (attr->ns == NULL) {
		    if (!xmlStrEqual(attr->name, BAD_CAST "source")) {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		} else {
		    if (xmlStrEqual(attr->ns->href, xmlSchemaNs) ||
			(xmlStrEqual(attr->name, BAD_CAST "lang") &&
			(!xmlStrEqual(attr->ns->href, XML_XML_NAMESPACE)))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
		attr = attr->next;
	    }
	    /*
	    * Attribute "xml:lang".
	    */
	    attr = xmlSchemaGetPropNodeNs(child, (const char *) XML_XML_NAMESPACE, "lang");
	    if (attr != NULL)
		xmlSchemaPValAttrNode(ctxt, NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE), NULL);
	    child = child->next;
	} else {
	    if (!barked)
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		    NULL, node, child, NULL, "(appinfo | documentation)*");
	    barked = 1;
	    child = child->next;
	}
    }

    return (ret);
}